

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall crnlib::mip_level::flip_y(mip_level *this)

{
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  dxt_image *this_01;
  bool bVar1;
  
  this_00 = this->m_pImage;
  this_01 = this->m_pDXTImage;
  if (this_00 != (image<crnlib::color_quad<unsigned_char,_int>_> *)0x0 ||
      this_01 != (dxt_image *)0x0) {
    if (this_01 != (dxt_image *)0x0) {
      bVar1 = dxt_image::flip_y(this_01);
      return bVar1;
    }
    if (this_00 != (image<crnlib::color_quad<unsigned_char,_int>_> *)0x0) {
      image<crnlib::color_quad<unsigned_char,_int>_>::flip_y(this_00);
      return true;
    }
  }
  return false;
}

Assistant:

bool mip_level::flip_y() {
  if (!is_valid())
    return false;

  if (m_pDXTImage)
    return m_pDXTImage->flip_y();
  else if (m_pImage) {
    m_pImage->flip_y();
    return true;
  }

  return false;
}